

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAabbUtil2.h
# Opt level: O0

bool TestTriangleAgainstAabb2(btVector3 *vertices,btVector3 *aabbMin,btVector3 *aabbMax)

{
  float fVar1;
  btVector3 *this;
  btVector3 *this_00;
  btScalar *pbVar2;
  btScalar *pbVar3;
  float *pfVar4;
  btVector3 *in_RDX;
  btVector3 *in_RSI;
  btVector3 *in_RDI;
  btVector3 *p3;
  btVector3 *p2;
  btVector3 *p1;
  bool local_1;
  
  this = in_RDI + 1;
  this_00 = in_RDI + 2;
  pbVar2 = btVector3::operator_cast_to_float_(in_RDI);
  pbVar3 = btVector3::operator_cast_to_float_(this);
  pfVar4 = btMin<float>(pbVar2,pbVar3);
  pbVar2 = btVector3::operator_cast_to_float_(this_00);
  pfVar4 = btMin<float>(pfVar4,pbVar2);
  fVar1 = *pfVar4;
  pbVar2 = btVector3::operator_cast_to_float_(in_RDX);
  if (fVar1 < *pbVar2 || fVar1 == *pbVar2) {
    pbVar2 = btVector3::operator_cast_to_float_(in_RDI);
    pbVar3 = btVector3::operator_cast_to_float_(this);
    pfVar4 = btMax<float>(pbVar2,pbVar3);
    pbVar2 = btVector3::operator_cast_to_float_(this_00);
    pfVar4 = btMax<float>(pfVar4,pbVar2);
    fVar1 = *pfVar4;
    pbVar2 = btVector3::operator_cast_to_float_(in_RSI);
    if (*pbVar2 <= fVar1) {
      pbVar2 = btVector3::operator_cast_to_float_(in_RDI);
      pbVar3 = btVector3::operator_cast_to_float_(this);
      pfVar4 = btMin<float>(pbVar2 + 2,pbVar3 + 2);
      pbVar2 = btVector3::operator_cast_to_float_(this_00);
      pfVar4 = btMin<float>(pfVar4,pbVar2 + 2);
      fVar1 = *pfVar4;
      pbVar2 = btVector3::operator_cast_to_float_(in_RDX);
      if (fVar1 < pbVar2[2] || fVar1 == pbVar2[2]) {
        pbVar2 = btVector3::operator_cast_to_float_(in_RDI);
        pbVar3 = btVector3::operator_cast_to_float_(this);
        pfVar4 = btMax<float>(pbVar2 + 2,pbVar3 + 2);
        pbVar2 = btVector3::operator_cast_to_float_(this_00);
        pfVar4 = btMax<float>(pfVar4,pbVar2 + 2);
        fVar1 = *pfVar4;
        pbVar2 = btVector3::operator_cast_to_float_(in_RSI);
        if (pbVar2[2] <= fVar1) {
          pbVar2 = btVector3::operator_cast_to_float_(in_RDI);
          pbVar3 = btVector3::operator_cast_to_float_(this);
          pfVar4 = btMin<float>(pbVar2 + 1,pbVar3 + 1);
          pbVar2 = btVector3::operator_cast_to_float_(this_00);
          pfVar4 = btMin<float>(pfVar4,pbVar2 + 1);
          fVar1 = *pfVar4;
          pbVar2 = btVector3::operator_cast_to_float_(in_RDX);
          if (fVar1 < pbVar2[1] || fVar1 == pbVar2[1]) {
            pbVar2 = btVector3::operator_cast_to_float_(in_RDI);
            pbVar3 = btVector3::operator_cast_to_float_(this);
            pfVar4 = btMax<float>(pbVar2 + 1,pbVar3 + 1);
            pbVar2 = btVector3::operator_cast_to_float_(this_00);
            pfVar4 = btMax<float>(pfVar4,pbVar2 + 1);
            fVar1 = *pfVar4;
            pbVar2 = btVector3::operator_cast_to_float_(in_RSI);
            if (pbVar2[1] <= fVar1) {
              local_1 = true;
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

SIMD_FORCE_INLINE bool TestTriangleAgainstAabb2(const btVector3 *vertices,
									const btVector3 &aabbMin, const btVector3 &aabbMax)
{
	const btVector3 &p1 = vertices[0];
	const btVector3 &p2 = vertices[1];
	const btVector3 &p3 = vertices[2];

	if (btMin(btMin(p1[0], p2[0]), p3[0]) > aabbMax[0]) return false;
	if (btMax(btMax(p1[0], p2[0]), p3[0]) < aabbMin[0]) return false;

	if (btMin(btMin(p1[2], p2[2]), p3[2]) > aabbMax[2]) return false;
	if (btMax(btMax(p1[2], p2[2]), p3[2]) < aabbMin[2]) return false;
  
	if (btMin(btMin(p1[1], p2[1]), p3[1]) > aabbMax[1]) return false;
	if (btMax(btMax(p1[1], p2[1]), p3[1]) < aabbMin[1]) return false;
	return true;
}